

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

vector<Character_*,_std::allocator<Character_*>_> * __thiscall
Map::CharactersInRange
          (vector<Character_*,_std::allocator<Character_*>_> *__return_storage_ptr__,Map *this,
          uchar x,uchar y,uchar range)

{
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  Character *local_40;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  uchar range_local;
  uchar y_local;
  uchar x_local;
  Map *this_local;
  vector<Character_*,_std::allocator<Character_*>_> *characters;
  
  std::vector<Character_*,_std::allocator<Character_*>_>::vector(__return_storage_ptr__);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar3 = std::_List_iterator<Character_*>::operator*(&__end1);
    local_40 = *ppCVar3;
    iVar2 = util::path_length((uint)local_40->x,(uint)local_40->y,(uint)x,(uint)y);
    if (iVar2 <= (int)(uint)range) {
      std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                (__return_storage_ptr__,&local_40);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Character *> Map::CharactersInRange(unsigned char x, unsigned char y, unsigned char range)
{
	std::vector<Character *> characters;

	UTIL_FOREACH(this->characters, character)
	{
		if (util::path_length(character->x, character->y, x, y) <= range)
			characters.push_back(character);
	}

	return characters;
}